

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O1

QPlatformMenu * __thiscall QMenuPrivate::createPlatformMenu(QMenuPrivate *this)

{
  long lVar1;
  Data *pDVar2;
  QPlatformMenu *pQVar3;
  
  lVar1 = *(long *)&(this->super_QWidgetPrivate).field_0x8;
  pDVar2 = (this->platformMenu).wp.d;
  if (((pDVar2 == (Data *)0x0) || (*(int *)(pDVar2 + 4) == 0)) ||
     ((this->platformMenu).wp.value == (QObject *)0x0)) {
    pQVar3 = (QPlatformMenu *)(**(code **)(*QGuiApplicationPrivate::platform_theme + 0x18))();
    setPlatformMenu(*(QMenuPrivate **)(lVar1 + 8),pQVar3);
    syncPlatformMenu(*(QMenuPrivate **)(lVar1 + 8));
  }
  pDVar2 = (this->platformMenu).wp.d;
  if ((pDVar2 == (Data *)0x0) || (*(int *)(pDVar2 + 4) == 0)) {
    pQVar3 = (QPlatformMenu *)0x0;
  }
  else {
    pQVar3 = (QPlatformMenu *)(this->platformMenu).wp.value;
  }
  return pQVar3;
}

Assistant:

QPlatformMenu *QMenuPrivate::createPlatformMenu()
{
    Q_Q(QMenu);
    if (platformMenu.isNull())
        q->setPlatformMenu(QGuiApplicationPrivate::platformTheme()->createPlatformMenu());
    return platformMenu.data();
}